

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymap.c
# Opt level: O3

void show_keymap_menu(nh_bool readonly)

{
  wchar_t wVar1;
  nh_bool nVar2;
  int __fd;
  nh_menuitem_conflict *items;
  size_t sVar3;
  wchar_t wVar4;
  char *pcVar5;
  wchar_t wVar6;
  nh_cmd_desc *pnVar7;
  long lVar8;
  long lVar9;
  nh_menuitem_conflict *item;
  nh_menuitem *_item_;
  ulong uVar10;
  fnchar filename [256];
  char buf [256];
  
  wVar1 = cmdcount;
  if (cmdcount == L'\0') {
    load_keymap();
  }
  items = (nh_menuitem_conflict *)malloc((long)cmdcount * 0x10c + 0x27c8);
  do {
    items->id = L'\0';
    items->role = MI_HEADING;
    items->accel = '\0';
    items->group_accel = '\0';
    items->selected = '\0';
    builtin_strncpy(items->caption,"Command\tDescription\tKey",0x18);
    lVar9 = 0x10c;
    wVar4 = L'\xffffffff';
    pnVar7 = builtin_commands;
    do {
      wVar6 = L'\0';
      if (readonly == '\0') {
        wVar6 = wVar4;
      }
      add_keylist_command(pnVar7,(nh_menuitem *)(items->caption + lVar9 + -8),wVar6);
      lVar9 = lVar9 + 0x10c;
      pnVar7 = pnVar7 + 1;
      wVar4 = wVar4 + L'\xffffffff';
    } while (lVar9 != 0x24a4);
    if (cmdcount < L'\x01') {
      wVar4 = L'#';
    }
    else {
      lVar9 = 0;
      lVar8 = 0;
      item = items + 0x23;
      do {
        lVar8 = lVar8 + 1;
        wVar4 = L'\0';
        if (readonly == '\0') {
          wVar4 = (wchar_t)lVar8;
        }
        add_keylist_command((nh_cmd_desc *)(commandlist->name + lVar9),(nh_menuitem *)item,wVar4);
        item = item + 1;
        lVar9 = lVar9 + 0x6c;
      } while (lVar8 < cmdcount);
      wVar4 = (wchar_t)lVar8 + L'#';
    }
    wVar6 = wVar4;
    if (readonly == '\0') {
      items[(uint)wVar4].accel = '\0';
      items[(uint)wVar4].group_accel = '\0';
      items[(uint)wVar4].selected = '\0';
      wVar6 = wVar4 + L'\x02';
      items[(uint)wVar4].caption[0] = '\0';
      items[(uint)wVar4].id = L'\0';
      items[(uint)wVar4].role = MI_TEXT;
      items[(ulong)(uint)wVar4 + 1].id = L'\xffffd8f0';
      items[(ulong)(uint)wVar4 + 1].role = MI_NORMAL;
      items[(ulong)(uint)wVar4 + 1].accel = '!';
      items[(ulong)(uint)wVar4 + 1].group_accel = '\0';
      items[(ulong)(uint)wVar4 + 1].selected = '\0';
      builtin_strncpy(items[(ulong)(uint)wVar4 + 1].caption,"!!!\tReset all ke",0x10);
      builtin_strncpy(items[(ulong)(uint)wVar4 + 1].caption + 0x10,"y bindings to bu",0x10);
      builtin_strncpy(items[(ulong)(uint)wVar4 + 1].caption + 0x20,"ilt-in defaults\t",0x10);
      builtin_strncpy(items[(ulong)(uint)wVar4 + 1].caption + 0x30,"!!!",4);
    }
    wVar4 = curses_display_menu_core
                      (items,wVar6,"Keymap",(uint)(readonly == '\0'),(wchar_t *)0x0,L'\0',L'\0',
                       _COLS,_LINES,set_command_keys,'\0');
  } while (L'\0' < wVar4);
  free(items);
  filename[0] = '\0';
  nVar2 = get_gamedir(CONFIG_DIR,filename);
  if (nVar2 != '\0') {
    sVar3 = strlen(filename);
    builtin_memcpy(filename + sVar3,"keymap.conf",0xc);
    __fd = open(filename,0x242,0x1a4);
    if (__fd != -1) {
      fchmod(__fd,0x1a4);
      uVar10 = 1;
      do {
        pnVar7 = keymap[uVar10];
        if ((pnVar7 == (nh_cmd_desc *)0x0) &&
           (pnVar7 = unknown_keymap[uVar10], pnVar7 == (nh_cmd_desc *)0x0)) {
          pnVar7 = (nh_cmd_desc *)0x11a61d;
        }
        sprintf(buf,"%x %s\n",uVar10 & 0xffffffff,pnVar7);
        sVar3 = strlen(buf);
        write(__fd,buf,sVar3);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 0x1ff);
      if (L'\0' < cmdcount) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          pcVar5 = "NOEXT %s\n";
          if ((*(uint *)(commandlist->desc + lVar8 + 0x54) >> 10 & 1) != 0) {
            pcVar5 = "EXT %s\n";
          }
          sprintf(buf,pcVar5,commandlist->name + lVar8);
          sVar3 = strlen(buf);
          write(__fd,buf,sVar3);
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x6c;
        } while (lVar9 < cmdcount);
      }
      if (L'\0' < unknown_count) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          pcVar5 = "NOEXT %s\n";
          if ((*(uint *)(unknown_commands->desc + lVar8 + 0x54) >> 10 & 1) != 0) {
            pcVar5 = "EXT %s\n";
          }
          sprintf(buf,pcVar5,unknown_commands->name + lVar8);
          sVar3 = strlen(buf);
          write(__fd,buf,sVar3);
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 0x6c;
        } while (lVar9 < unknown_count);
      }
      close(__fd);
    }
  }
  if (wVar1 == L'\0') {
    free_keymap();
  }
  return;
}

Assistant:

void show_keymap_menu(nh_bool readonly)
{
    int i, n, icount;
    nh_bool need_init = !cmdcount;
    struct nh_menuitem *items;

    if (need_init)
	load_keymap();

    items = malloc(sizeof(struct nh_menuitem) *
                                 (ARRAY_SIZE(builtin_commands) + cmdcount + 4));
    
    do {
	set_menuitem(&items[0], 0, MI_HEADING, "Command\tDescription\tKey", 0, FALSE);
	icount = 1;
	/* add builtin commands */
	for (i = 0; i < ARRAY_SIZE(builtin_commands); i++) {
	    add_keylist_command(&builtin_commands[i], &items[icount],
				readonly ? 0 : -(i+1));
	    icount++;
	}
	
	/* add in-game commands */
	for (i = 0; i < cmdcount; i++) {
	    add_keylist_command(&commandlist[i], &items[icount],
				readonly ? 0 : (i+1));
	    icount++;
	}
	
	if (!readonly) {
	    set_menuitem(&items[icount++], 0, MI_TEXT, "", 0, FALSE);
	    set_menuitem(&items[icount++], RESET_BINDINGS_ID, MI_NORMAL,
			"!!!\tReset all key bindings to built-in defaults\t!!!", '!', FALSE);
	}
	n = curses_display_menu_core(items, icount, "Keymap", readonly ? PICK_NONE :
				     PICK_ONE, NULL, 0, 0, COLS, LINES,
				     set_command_keys, FALSE);
    } while(n > 0);
    free(items);
    
    write_keymap();

    if (need_init)
	free_keymap();
}